

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void read_big_endian_2byte_word(unsigned_short *blockadr,FILE *f)

{
  uint8 bytes [2];
  undefined2 local_1a;
  
  fread(&local_1a,1,1,(FILE *)f);
  fread((void *)((long)&local_1a + 1),1,1,(FILE *)f);
  *blockadr = local_1a << 8 | local_1a >> 8;
  return;
}

Assistant:

void read_big_endian_2byte_word(unsigned short *blockadr, FILE *f)
{
	uint8 bytes[2];
	unsigned short block;

	fread(&bytes[0], 1, 1, f);
	fread(&bytes[1], 1, 1, f);

	block = 0;
	block |= bytes[0];
	block = block << 8;
	block |= bytes[1];

	blockadr[0] = block;
}